

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

DecodeStatus Decode2OpInstructionFail(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint *Decoder_00;
  uint uVar2;
  
  Decoder_00 = &switchD_00262666::switchdataD_00591c10;
  switch(Insn >> 0xb & 0x1f) {
  case 0:
    uVar2 = 0xe6;
    goto LAB_0026278c;
  case 1:
    uVar2 = 0xa3;
    goto LAB_0026278c;
  case 2:
    uVar2 = 0x17;
    break;
  case 3:
    uVar2 = 0xe9;
    break;
  case 4:
    uVar2 = 0xd7;
    break;
  case 5:
    uVar2 = 0xd9;
    break;
  case 6:
    uVar2 = 0x56;
    break;
  case 7:
    uVar2 = 0x1b;
    break;
  case 8:
    uVar2 = 0xb2;
    break;
  case 9:
    uVar2 = 0xa4;
    break;
  default:
    return MCDisassembler_Fail;
  case 0x10:
    uVar2 = 0x7f;
    break;
  case 0x11:
    uVar2 = 0x80;
    break;
  case 0x12:
    uVar2 = 0x16;
    goto LAB_0026278c;
  case 0x13:
    uVar2 = 0xe8;
    goto LAB_0026278c;
  case 0x14:
    uVar2 = 0xd6;
    goto LAB_00262714;
  case 0x15:
    uVar2 = 0xd8;
LAB_00262714:
    MCInst_setOpcode(Inst,uVar2);
    DVar1 = Decode2RUSBitpInstruction(Inst,Insn,Address,Decoder_00);
    return DVar1;
  case 0x16:
    uVar2 = 0x55;
LAB_0026278c:
    MCInst_setOpcode(Inst,uVar2);
    DVar1 = Decode2RUSInstruction(Inst,Insn,Address,Decoder_00);
    return DVar1;
  case 0x17:
    MCInst_setOpcode(Inst,0xef);
    DVar1 = Decode3RImmInstruction(Inst,Insn,Address,Decoder_00);
    return DVar1;
  case 0x18:
    uVar2 = 0xa6;
    break;
  case 0x19:
    uVar2 = 0xa8;
  }
  MCInst_setOpcode(Inst,uVar2);
  DVar1 = Decode3RInstruction(Inst,Insn,Address,Decoder_00);
  return DVar1;
}

Assistant:

static DecodeStatus Decode2OpInstructionFail(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	// Try and decode as a 3R instruction.
	unsigned Opcode = fieldFromInstruction_4(Insn, 11, 5);
	switch (Opcode) {
		case 0x0:
			MCInst_setOpcode(Inst, XCore_STW_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x1:
			MCInst_setOpcode(Inst, XCore_LDW_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x2:
			MCInst_setOpcode(Inst, XCore_ADD_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x3:
			MCInst_setOpcode(Inst, XCore_SUB_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x4:
			MCInst_setOpcode(Inst, XCore_SHL_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x5:
			MCInst_setOpcode(Inst, XCore_SHR_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x6:
			MCInst_setOpcode(Inst, XCore_EQ_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x7:
			MCInst_setOpcode(Inst, XCore_AND_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x8:
			MCInst_setOpcode(Inst, XCore_OR_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x9:
			MCInst_setOpcode(Inst, XCore_LDW_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x10:
			MCInst_setOpcode(Inst, XCore_LD16S_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x11:
			MCInst_setOpcode(Inst, XCore_LD8U_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x12:
			MCInst_setOpcode(Inst, XCore_ADD_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x13:
			MCInst_setOpcode(Inst, XCore_SUB_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x14:
			MCInst_setOpcode(Inst, XCore_SHL_2rus);
			return Decode2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x15:
			MCInst_setOpcode(Inst, XCore_SHR_2rus);
			return Decode2RUSBitpInstruction(Inst, Insn, Address, Decoder);
		case 0x16:
			MCInst_setOpcode(Inst, XCore_EQ_2rus);
			return Decode2RUSInstruction(Inst, Insn, Address, Decoder);
		case 0x17:
			MCInst_setOpcode(Inst, XCore_TSETR_3r);
			return Decode3RImmInstruction(Inst, Insn, Address, Decoder);
		case 0x18:
			MCInst_setOpcode(Inst, XCore_LSS_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
		case 0x19:
			MCInst_setOpcode(Inst, XCore_LSU_3r);
			return Decode3RInstruction(Inst, Insn, Address, Decoder);
	}

	return MCDisassembler_Fail;
}